

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O0

void sat_solver_set_var_activity(sat_solver *s,int *pVars,int nVars)

{
  word wVar1;
  int local_30;
  int local_2c;
  int iVar_1;
  int iVar;
  int i;
  int nVars_local;
  int *pVars_local;
  sat_solver *s_local;
  
  for (iVar_1 = 0; iVar_1 < s->size; iVar_1 = iVar_1 + 1) {
    s->activity[iVar_1] = 0;
  }
  if (s->VarActType == 0) {
    s->var_inc = 0x20;
    s->var_decay = 0xffffffffffffffff;
    for (iVar_1 = 0; iVar_1 < nVars; iVar_1 = iVar_1 + 1) {
      if (pVars == (int *)0x0) {
        local_2c = iVar_1;
      }
      else {
        local_2c = pVars[iVar_1];
      }
      s->activity[local_2c] = s->var_inc * (long)(nVars - iVar_1);
      if (s->orderpos[local_2c] != -1) {
        order_update(s,local_2c);
      }
    }
  }
  else {
    if (s->VarActType != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0xf5,"void sat_solver_set_var_activity(sat_solver *, int *, int)");
    }
    wVar1 = Abc_Dbl2Word(1.0);
    s->var_inc = wVar1;
    for (iVar_1 = 0; iVar_1 < nVars; iVar_1 = iVar_1 + 1) {
      if (pVars == (int *)0x0) {
        local_30 = iVar_1;
      }
      else {
        local_30 = pVars[iVar_1];
      }
      wVar1 = Abc_Dbl2Word((double)(nVars - iVar_1));
      s->activity[local_30] = wVar1;
      if (s->orderpos[local_30] != -1) {
        order_update(s,local_30);
      }
    }
  }
  return;
}

Assistant:

void sat_solver_set_var_activity(sat_solver* s, int * pVars, int nVars) 
{
    int i;
    for (i = 0; i < s->size; i++)
        s->activity[i] = 0;
    if ( s->VarActType == 0 )
    {
        s->var_inc            = (1 <<  5);
        s->var_decay          = -1;
        for ( i = 0; i < nVars; i++ )
        {
            int iVar = pVars ? pVars[i] : i;
            s->activity[iVar] = s->var_inc*(nVars-i);
            if (s->orderpos[iVar] != -1)
                order_update( s, iVar );
        }
    }
    else if ( s->VarActType == 1 )
    {
        s->var_inc = Abc_Dbl2Word(1);
        for ( i = 0; i < nVars; i++ )
        {
            int iVar = pVars ? pVars[i] : i;
            s->activity[iVar] = Abc_Dbl2Word(nVars-i);
            if (s->orderpos[iVar] != -1)
                order_update( s, iVar );
        }
    }
    else assert( 0 );
}